

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestAnalogInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  ostream *poVar8;
  void *this;
  undefined1 auVar9 [16];
  int local_ec;
  undefined8 uStack_e8;
  int numValid;
  double potV [4];
  unsigned_long pot [4];
  bool tmp_pass;
  int potStart;
  bool pass;
  double measured;
  char buf [80];
  int local_30;
  int j;
  int i;
  uint qlaNum_local;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  bVar2 = true;
  iVar4 = 0;
  if (qlaNum == 2) {
    iVar4 = 4;
  }
  poVar8 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"=== Analog Inputs ===");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  Amp1394Console::Print
            (curLine,9,"This test uses the pot on the test board to set a voltage (+/-0.25V)");
  bVar3 = false;
  while (!bVar3) {
    Amp1394Console::Print(curLine + 1,9,"Enter pot voltage: ");
    Amp1394Console::GetString((char *)&measured,0x50);
    iVar5 = __isoc99_sscanf(&measured,"%lf",&potStart);
    if (iVar5 == 1) {
      bVar3 = true;
    }
  }
  poVar8 = std::operator<<((ostream *)logFile,"   Input voltage: ");
  this = (void *)std::ostream::operator<<(poVar8,_potStart);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  memset(potV + 3,0,0x20);
  local_ec = 0;
  for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
    uVar6 = (*Port->_vptr_BasePort[0x1d])();
    if ((uVar6 & 1) != 0) {
      local_ec = local_ec + 1;
      buf[0x4c] = '\0';
      buf[0x4d] = '\0';
      buf[0x4e] = '\0';
      buf[0x4f] = '\0';
      for (; (int)buf._76_4_ < 4; buf._76_4_ = buf._76_4_ + 1) {
        uVar7 = AmpIO::GetAnalogInput(Board,iVar4 + buf._76_4_);
        potV[(long)(int)buf._76_4_ + 3] =
             (double)((ulong)uVar7 + (long)potV[(long)(int)buf._76_4_ + 3]);
      }
    }
  }
  if (local_ec < 1) {
    poVar8 = std::operator<<((ostream *)logFile,"   No valid readings!");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    bVar2 = false;
  }
  else {
    std::operator<<((ostream *)logFile,"   Readings: ");
    buf[0x4c] = '\0';
    buf[0x4d] = '\0';
    buf[0x4e] = '\0';
    buf[0x4f] = '\0';
    for (; (int)buf._76_4_ < 4; buf._76_4_ = buf._76_4_ + 1) {
      potV[(long)(int)buf._76_4_ + 3] =
           (double)((ulong)potV[(long)(int)buf._76_4_ + 3] / (ulong)(long)local_ec);
      dVar1 = potV[(long)(int)buf._76_4_ + 3];
      auVar9._8_4_ = (int)((ulong)dVar1 >> 0x20);
      auVar9._0_8_ = dVar1;
      auVar9._12_4_ = 0x45300000;
      potV[(long)(int)buf._76_4_ + -1] =
           (((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0)) * 4.5) / 65535.0;
      poVar8 = (ostream *)std::ostream::operator<<(logFile,potV[(long)(int)buf._76_4_ + -1]);
      std::operator<<(poVar8," ");
      if (0.25 < ABS(potV[(long)(int)buf._76_4_ + -1] - _potStart)) {
        bVar2 = false;
      }
    }
  }
  if (bVar2 == false) {
    poVar8 = std::operator<<((ostream *)logFile,"- FAIL");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&measured,"Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)",uStack_e8,
            potV[0]._0_4_,potV[1],potV[2]);
  }
  else {
    poVar8 = std::operator<<((ostream *)logFile,"- PASS");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&measured,"Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)",uStack_e8,
            potV[0]._0_4_,potV[1],potV[2]);
  }
  Amp1394Console::Print(curLine + 2,9,(char *)&measured);
  return bVar2;
}

Assistant:

bool TestAnalogInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    char buf[80];
    double measured;
    bool pass = true;

    int potStart = (qlaNum == 2) ? 4 : 0;

    logFile << std::endl << "=== Analog Inputs ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the pot on the test board to set a voltage (+/-0.25V)");
    bool tmp_pass = false;
    while (!tmp_pass) {
        Amp1394Console::Print(curLine, 9, "Enter pot voltage: ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if (sscanf(buf, "%lf", &measured) == 1) tmp_pass = true;
    }
    logFile << "   Input voltage: " << measured << std::endl;
    curLine++;
    // Average 16 readings to reduce noise
    unsigned long pot[4] = { 0, 0, 0, 0};
    double potV[4];
    int numValid = 0;
    for (i = 0; i < 16; i++) {
        if (Port->ReadAllBoards()) {
            numValid++;
            for (j = 0; j < 4; j++)
                pot[j] += Board.GetAnalogInput(potStart+j);
        }
    }
    if (numValid > 0) {
        logFile << "   Readings: ";
        for (j = 0; j < 4; j++) {
            pot[j] /= numValid;
            // Convert to voltage (16-bit converter, Vref = 4.5V)
            potV[j] = pot[j]*4.5/65535;
            logFile << potV[j] << " ";
            if (fabs(potV[j] - measured) > 0.25)
                pass = false;
        }
    }
    else {
        logFile << "   No valid readings!" << std::endl;
        pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }

    Amp1394Console::Print(curLine, 9, buf);
    return pass;
}